

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_string.c
# Opt level: O3

ssize_t mpt_encode_string(mpt_encode_state *info,iovec *to,iovec *from)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  void *pvVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  void *pvVar8;
  char *pcVar9;
  long lVar10;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  size_t __n;
  char *__s;
  long lVar14;
  iovec tmp;
  iovec local_40;
  
  if (to == (iovec *)0x0) {
    info->_ctx = 0;
    info->done = 0;
    info->scratch = 0;
  }
  else {
    sVar3 = info->done;
    __n = info->scratch;
    uVar2 = sVar3 + __n;
    uVar13 = to->iov_len;
    if (uVar13 < uVar2) {
      return -1;
    }
    pvVar4 = to->iov_base;
    if (from != (iovec *)0x0) {
      uVar5 = from->iov_len;
      if (uVar5 == 0) {
        return -1;
      }
      __s = (char *)from->iov_base;
      if (__s != (char *)0x0) {
        uVar13 = uVar13 - uVar2;
        if (uVar13 == 0) {
          return -0x11;
        }
        if (uVar5 < uVar13) {
          uVar13 = uVar5;
        }
        if (__n == 0) {
          pvVar8 = memchr(__s,(int)info->_ctx,uVar13);
          if (pvVar8 != (void *)0x0) {
            return -8;
          }
        }
        else {
          lVar14 = 1 - uVar5;
          if (uVar2 < uVar5) {
            lVar14 = -uVar2;
          }
          pcVar7 = (char *)((long)pvVar4 + uVar2);
          if (lVar14 < (long)(uVar13 - uVar5)) {
            pcVar11 = pcVar7 + (lVar14 - uVar5);
            lVar12 = -lVar14;
            do {
              if (lVar14 == 0) {
                pcVar11 = __s;
              }
              lVar1 = lVar14 + 1;
              if (*pcVar11 == *pcVar7) {
                lVar10 = lVar1;
                if (lVar14 < (long)(lVar1 + uVar5)) {
                  pcVar9 = pcVar11;
                  lVar14 = 0;
                  do {
                    pcVar9 = pcVar9 + 1;
                    if (lVar12 + -1 == lVar14) {
                      pcVar9 = __s;
                    }
                    lVar10 = lVar14 + 1;
                    lVar6 = lVar14 + uVar2 + 1;
                    lVar14 = lVar10;
                  } while (*pcVar9 == *(char *)((long)pvVar4 + lVar6));
                  lVar10 = lVar10 - lVar12;
                }
                if (lVar10 == lVar1 + uVar5) {
                  return -3;
                }
              }
              pcVar11 = pcVar11 + 1;
              lVar12 = lVar12 + -1;
              lVar14 = lVar1;
            } while (lVar1 < (long)(uVar13 - uVar5));
          }
          memmove(pcVar7 + (uVar13 - __n),(void *)((long)pvVar4 + sVar3),__n);
          __s = (char *)from->iov_base;
        }
        memcpy((void *)((long)pvVar4 + sVar3),__s,uVar13);
        info->done = uVar2 + uVar13;
        return uVar13;
      }
      if (uVar2 != 0) {
        local_40.iov_len = uVar2 - (*(char *)((long)pvVar4 + (uVar2 - 1)) == '\0');
        lVar14 = uVar5 + 1;
        do {
          lVar14 = lVar14 + -1;
          if (lVar14 == 0) {
            info->done = info->done - local_40.iov_len;
            return local_40.iov_len;
          }
          local_40.iov_base = pvVar4;
          local_40.iov_len = mpt_memrchr(&local_40,1,(int)info->_ctx);
        } while (-1 < (long)local_40.iov_len);
      }
      return -0x10;
    }
    if (__n == 0) {
      if (uVar13 == uVar2) {
        return -0x11;
      }
      *(char *)((long)pvVar4 + uVar2) = (char)info->_ctx;
      __n = 1;
    }
    else {
      if (uVar13 - uVar2 < __n) {
        return -0x11;
      }
      memcpy((void *)(sVar3 + (long)pvVar4),(void *)((long)pvVar4 + uVar2),__n);
    }
    info->done = __n + uVar2;
  }
  return 0;
}

Assistant:

extern ssize_t mpt_encode_string(MPT_STRUCT(encode_state) *info, const struct iovec *to, const struct iovec *from)
{
	uint8_t *base;
	size_t sep, len, off, max;
	
	if (!to) {
		info->_ctx = 0;
		info->done = 0;
		info->scratch = 0;
		return 0;
	}
	sep = info->scratch;
	off = info->done + info->scratch;
	
	base = to->iov_base;
	max  = to->iov_len;
	
	if (off > max) {
		return -1;
	}
	/* terminate string */
	if (!from) {
		max -= off;
		
		if (!sep) {
			if (!max) {
				return MPT_ERROR(MissingBuffer);
			}
			base[off++] = info->_ctx;
		}
		else if (max < sep) {
			return MPT_ERROR(MissingBuffer);
		}
		else {
			base += off;
			memcpy(base-sep, base, sep);
			off += sep;
		}
		info->done = off;
		
		/* push delimiter data */
		return 0;
	}
	/* start priority data */
	if (!(len = from->iov_len)) {
		return MPT_ERROR(BadArgument);
	}
	/* delete buffered data */
	if (!from->iov_base) {
		/* no data available */
		if (!off) {
			return MPT_ERROR(MissingData);
		}
		/* no active message, remove endbyte */
		if (!(base)[off-1]) {
			--off;
		}
		while (len--) {
			struct iovec tmp;
			ssize_t pos;
			
			tmp.iov_base = base;
			tmp.iov_len  = off;
			
			/* find message separator */
			if ((pos = mpt_memrchr(&tmp, 1, info->_ctx)) >= 0) {
				off = pos;
				continue;
			}
			return MPT_ERROR(MissingData);
		}
		info->done -= off;
		
		return off;
	}
	if (!(max -= off)) {
		return MPT_ERROR(MissingBuffer);
	}
	base += off;
	if (len < max) {
		max = from->iov_len;
	}
	/* invalid data */
	if (len) {
		if (!sep) {
			if (max && memchr(from->iov_base, info->_ctx, max)) {
				return MPT_ERROR(BadEncoding);
			}
		}
		/* check longer separator pattern */
		else {
			const uint8_t *cmp = base, *val;
			ssize_t i, total;
			
			/* relative compare start position */
			i = (off < len) ? -off : 1 - len;
			
			total = max - len;
			for (val = base - len + i; i < total; ++i, ++val) {
				const uint8_t *v2, *c2;
				ssize_t j, k;
				if (!i) val = from->iov_base;
				if (*val != *cmp) continue;
				v2 = val + 1;
				c2 = cmp + 1;
				for (j = i+1, k = j+len; i < k; ++j) {
					if (!j) v2 = from->iov_base;
					if (*(v2++) != *(c2++)) {
						break;
					}
				}
				if (j == k) {
					return -3;
				}
			}
			/* move delimiter string */
			memmove(base+max-sep, base-sep, sep);
		}
	}
	else if (memchr(from->iov_base, info->_ctx, max)) {
		return MPT_ERROR(BadEncoding);
	}
	/* copy source data */
	memcpy(base-sep, from->iov_base, max);
	off += max;
	
	info->done = off;
	
	return max;
}